

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O3

size_t int_tcfg_list(size_t maxItems,TRUN_ConfigItem *outArray)

{
  if (outArray != (TRUN_ConfigItem *)0x0) {
    if (maxItems == 0) {
      return 0;
    }
    *(undefined8 *)(outArray->name + 0x1f) = 0;
    (outArray->value).str = (char *)0x0;
    outArray->name[0xf] = '\0';
    outArray->name[0x10] = '\0';
    outArray->name[0x11] = '\0';
    outArray->name[0x12] = '\0';
    outArray->name[0x13] = '\0';
    outArray->name[0x14] = '\0';
    outArray->name[0x15] = '\0';
    outArray->name[0x16] = '\0';
    outArray->name[0x17] = '\0';
    outArray->name[0x18] = '\0';
    outArray->name[0x19] = '\0';
    outArray->name[0x1a] = '\0';
    outArray->name[0x1b] = '\0';
    outArray->name[0x1c] = '\0';
    outArray->name[0x1d] = '\0';
    outArray->name[0x1e] = '\0';
    outArray->isValid = false;
    outArray->name[0] = '\0';
    outArray->name[1] = '\0';
    outArray->name[2] = '\0';
    outArray->name[3] = '\0';
    outArray->name[4] = '\0';
    outArray->name[5] = '\0';
    outArray->name[6] = '\0';
    outArray->name[7] = '\0';
    outArray->name[8] = '\0';
    outArray->name[9] = '\0';
    outArray->name[10] = '\0';
    outArray->name[0xb] = '\0';
    outArray->name[0xc] = '\0';
    outArray->name[0xd] = '\0';
    outArray->name[0xe] = '\0';
  }
  return 1;
}

Assistant:

static size_t int_tcfg_list(size_t maxItems, TRUN_ConfigItem *outArray) {
    // Return number of items available

    size_t nGlbItems = 0;
    auto glb_config = get_config_items(&nGlbItems);

    if (outArray == nullptr) {
        return nGlbItems;
    }

    size_t nToCopy = (maxItems<nGlbItems)?maxItems:nGlbItems;
    for(size_t i=0;i<nToCopy;i++) {
        outArray[i] = glb_config[i];
    }
    return nToCopy;
}